

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2151.c
# Opt level: O3

void refresh_EG(YM2151Operator *op)

{
  uint uVar1;
  UINT8 UVar2;
  uint uVar3;
  UINT8 UVar4;
  UINT8 UVar5;
  uint uVar6;
  
  uVar1 = op->kc;
  uVar6 = uVar1 >> ((byte)op->ks & 0x1f);
  uVar3 = op->ar + uVar6;
  UVar5 = 0x88;
  if (uVar3 < 0x5e) {
    UVar2 = ""[uVar3];
    UVar4 = eg_rate_select[uVar3];
  }
  else {
    UVar2 = '\0';
    UVar4 = 0x88;
  }
  op->eg_sh_ar = UVar2;
  op->eg_sel_ar = UVar4;
  uVar3 = op->d1r + uVar6;
  op->eg_sh_d1r = ""[uVar3];
  op->eg_sel_d1r = eg_rate_select[uVar3];
  uVar3 = op->d2r + uVar6;
  op->eg_sh_d2r = ""[uVar3];
  op->eg_sel_d2r = eg_rate_select[uVar3];
  uVar6 = uVar6 + op->rr;
  op->eg_sh_rr = ""[uVar6];
  op->eg_sel_rr = eg_rate_select[uVar6];
  uVar6 = uVar1 >> ((byte)op[1].ks & 0x1f);
  uVar3 = op[1].ar + uVar6;
  if (uVar3 < 0x5e) {
    UVar2 = ""[uVar3];
    UVar5 = eg_rate_select[uVar3];
  }
  else {
    UVar2 = '\0';
  }
  op[1].eg_sh_ar = UVar2;
  op[1].eg_sel_ar = UVar5;
  uVar3 = op[1].d1r + uVar6;
  op[1].eg_sh_d1r = ""[uVar3];
  op[1].eg_sel_d1r = eg_rate_select[uVar3];
  uVar3 = op[1].d2r + uVar6;
  op[1].eg_sh_d2r = ""[uVar3];
  op[1].eg_sel_d2r = eg_rate_select[uVar3];
  uVar6 = uVar6 + op[1].rr;
  op[1].eg_sh_rr = ""[uVar6];
  op[1].eg_sel_rr = eg_rate_select[uVar6];
  uVar6 = uVar1 >> ((byte)op[2].ks & 0x1f);
  uVar3 = op[2].ar + uVar6;
  UVar5 = 0x88;
  if (uVar3 < 0x5e) {
    UVar2 = ""[uVar3];
    UVar4 = eg_rate_select[uVar3];
  }
  else {
    UVar2 = '\0';
    UVar4 = 0x88;
  }
  op[2].eg_sh_ar = UVar2;
  op[2].eg_sel_ar = UVar4;
  uVar3 = op[2].d1r + uVar6;
  op[2].eg_sh_d1r = ""[uVar3];
  op[2].eg_sel_d1r = eg_rate_select[uVar3];
  uVar3 = op[2].d2r + uVar6;
  op[2].eg_sh_d2r = ""[uVar3];
  op[2].eg_sel_d2r = eg_rate_select[uVar3];
  uVar6 = uVar6 + op[2].rr;
  op[2].eg_sh_rr = ""[uVar6];
  op[2].eg_sel_rr = eg_rate_select[uVar6];
  uVar1 = uVar1 >> ((byte)op[3].ks & 0x1f);
  uVar3 = op[3].ar + uVar1;
  if (uVar3 < 0x5e) {
    UVar2 = ""[uVar3];
    UVar5 = eg_rate_select[uVar3];
  }
  else {
    UVar2 = '\0';
  }
  op[3].eg_sh_ar = UVar2;
  op[3].eg_sel_ar = UVar5;
  uVar3 = op[3].d1r + uVar1;
  op[3].eg_sh_d1r = ""[uVar3];
  op[3].eg_sel_d1r = eg_rate_select[uVar3];
  uVar3 = op[3].d2r + uVar1;
  op[3].eg_sh_d2r = ""[uVar3];
  op[3].eg_sel_d2r = eg_rate_select[uVar3];
  uVar1 = uVar1 + op[3].rr;
  op[3].eg_sh_rr = ""[uVar1];
  op[3].eg_sel_rr = eg_rate_select[uVar1];
  return;
}

Assistant:

INLINE void refresh_EG(YM2151Operator * op)
{
	UINT32 kc;
	UINT32 v;

	kc = op->kc;

	/* v = 32 + 2*RATE + RKS = max 126 */

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];


	op+=1;

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];

	op+=1;

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];

	op+=1;

	v = kc >> op->ks;
	if ((op->ar+v) < 32+62)
	{
		op->eg_sh_ar  = eg_rate_shift [op->ar  + v ];
		op->eg_sel_ar = eg_rate_select[op->ar  + v ];
	}
	else
	{
		op->eg_sh_ar  = 0;
		op->eg_sel_ar = 17*RATE_STEPS;
	}
	op->eg_sh_d1r = eg_rate_shift [op->d1r + v];
	op->eg_sel_d1r= eg_rate_select[op->d1r + v];
	op->eg_sh_d2r = eg_rate_shift [op->d2r + v];
	op->eg_sel_d2r= eg_rate_select[op->d2r + v];
	op->eg_sh_rr  = eg_rate_shift [op->rr  + v];
	op->eg_sel_rr = eg_rate_select[op->rr  + v];
}